

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonwriter.cpp
# Opt level: O0

void __thiscall CJsonWriter::PushState(CJsonWriter *this,uchar NewState)

{
  uchar in_SIL;
  long in_RDI;
  long in_FS_OFFSET;
  undefined7 in_stack_ffffffffffffffe0;
  CState local_a;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  dbg_assert_imp((char *)CONCAT17(in_SIL,in_stack_ffffffffffffffe0),(int)((ulong)in_RDI >> 0x20),
                 (int)in_RDI,(char *)0x23d7bf);
  if (*(int *)(in_RDI + 0x28) != 0) {
    *(undefined1 *)(in_RDI + 9 + (long)(*(int *)(in_RDI + 0x28) + -1) * 2) = 0;
  }
  CState::CState(&local_a,in_SIL);
  *(CState *)(in_RDI + 8 + (long)*(int *)(in_RDI + 0x28) * 2) = local_a;
  *(int *)(in_RDI + 0x28) = *(int *)(in_RDI + 0x28) + 1;
  if (in_SIL != '\x03') {
    *(int *)(in_RDI + 0x2c) = *(int *)(in_RDI + 0x2c) + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CJsonWriter::PushState(unsigned char NewState)
{
	dbg_assert(m_NumStates < MAX_DEPTH, "max json depth exceeded");
	if(m_NumStates != 0)
	{
		m_aStates[m_NumStates - 1].m_Empty = false;
	}
	m_aStates[m_NumStates] = CState(NewState);
	m_NumStates++;
	if(NewState != STATE_ATTRIBUTE)
	{
		m_Indentation++;
	}
}